

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O1

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CBinopExpression *expression)

{
  TOperationType _operation;
  CExpression *pCVar1;
  CExpression *pCVar2;
  CBinopExpression *this_00;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_30;
  
  pCVar1 = CBinopExpression::getLeftOperand(expression);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  pCVar1 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar2 = CBinopExpression::getRightOperand(expression);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  pCVar2 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  this_00 = (CBinopExpression *)operator_new(0x20);
  local_38._M_head_impl = pCVar2;
  local_30._M_head_impl = pCVar1;
  _operation = CBinopExpression::getOperation(expression);
  CBinopExpression::CBinopExpression
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_30,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_38,_operation);
  pCVar1 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_00;
  if (pCVar1 != (CExpression *)0x0) {
    (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
  }
  if (local_38._M_head_impl != (CExpression *)0x0) {
    (*((local_38._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_38._M_head_impl = (CExpression *)0x0;
  if (local_30._M_head_impl != (CExpression *)0x0) {
    (*((local_30._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CBinopExpression &expression) {
    expression.getLeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> leftExpression = std::move(childExpression);

    expression.getRightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> rightExpression = std::move(childExpression);

    childExpression = std::move(
            std::unique_ptr<const CExpression>(
                new CBinopExpression(
                        std::move(leftExpression),
                        std::move(rightExpression),
                        expression.getOperation()
                )
            )
    );
}